

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O1

void load_history(void)

{
  byte *pbVar1;
  Fl_Menu_Item *pFVar2;
  ulong uVar3;
  long lVar4;
  char (*to) [2048];
  char (*text) [2048];
  int max_files;
  int local_3c;
  Name local_38;
  
  Fl_Preferences::get(&fluid_prefs,"recent_files",&local_3c,5);
  if (10 < local_3c) {
    local_3c = 10;
  }
  if (local_3c < 1) {
    uVar3 = 0;
  }
  else {
    to = relative_history;
    text = absolute_history;
    lVar4 = 0x20;
    uVar3 = 0;
    do {
      Fl_Preferences::Name::Name(&local_38,"file%d",uVar3 & 0xffffffff);
      Fl_Preferences::get(&fluid_prefs,local_38.data_,*text,"",0x800);
      Fl_Preferences::Name::~Name(&local_38);
      if ((*text)[0] == '\0') break;
      fl_filename_relative(*to,0x800,*text);
      *(uint *)((long)&history_item->text + lVar4) = (uint)(uVar3 == 9) << 7;
      uVar3 = uVar3 + 1;
      to = to + 1;
      text = text + 1;
      lVar4 = lVar4 + 0x38;
    } while ((long)uVar3 < (long)local_3c);
  }
  pFVar2 = history_item;
  if ((uint)uVar3 < 10) {
    lVar4 = (uVar3 & 0xffffffff) * 0x38;
    do {
      if (lVar4 != 0) {
        pbVar1 = (byte *)((long)pFVar2 + lVar4 + -0x18);
        *pbVar1 = *pbVar1 | 0x80;
      }
      pbVar1 = (byte *)((long)&pFVar2->flags + lVar4);
      *pbVar1 = *pbVar1 | 0x10;
      lVar4 = lVar4 + 0x38;
    } while (lVar4 != 0x230);
  }
  return;
}

Assistant:

void load_history() {
  int	i;		// Looping var
  int	max_files;


  fluid_prefs.get("recent_files", max_files, 5);
  if (max_files > 10) max_files = 10;

  for (i = 0; i < max_files; i ++) {
    fluid_prefs.get( Fl_Preferences::Name("file%d", i), absolute_history[i], "", sizeof(absolute_history[i]));
    if (absolute_history[i][0]) {
      // Make a relative version of the filename for the menu...
      fl_filename_relative(relative_history[i], sizeof(relative_history[i]),
                           absolute_history[i]);

      if (i == 9) history_item[i].flags = FL_MENU_DIVIDER;
      else history_item[i].flags = 0;
    } else break;
  }

  for (; i < 10; i ++) {
    if (i) history_item[i-1].flags |= FL_MENU_DIVIDER;
    history_item[i].hide();
  }
}